

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbarlayout.cpp
# Opt level: O3

bool __thiscall QToolBarLayout::movable(QToolBarLayout *this)

{
  bool bVar1;
  QToolBar *this_00;
  long lVar2;
  
  QLayout::parentWidget(&this->super_QLayout);
  this_00 = (QToolBar *)QMetaObject::cast((QObject *)&QToolBar::staticMetaObject);
  if (this_00 == (QToolBar *)0x0) {
    bVar1 = false;
  }
  else {
    lVar2 = QMetaObject::cast((QObject *)&QMainWindow::staticMetaObject);
    bVar1 = QToolBar::isMovable(this_00);
    bVar1 = lVar2 != 0 && bVar1;
  }
  return bVar1;
}

Assistant:

bool QToolBarLayout::movable() const
{
    QToolBar *tb = qobject_cast<QToolBar*>(parentWidget());
    if (!tb)
        return false;
    QMainWindow *win = qobject_cast<QMainWindow*>(tb->parentWidget());
    return tb->isMovable() && win != nullptr;
}